

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O2

void __thiscall vec<double>::growTo(vec<double> *this,uint size,double *pad)

{
  double *pdVar1;
  ulong uVar2;
  
  if (this->sz < size) {
    reserve(this,size);
    pdVar1 = this->data;
    for (uVar2 = (ulong)this->sz; uVar2 < size; uVar2 = uVar2 + 1) {
      pdVar1[uVar2] = *pad;
    }
    this->sz = size;
  }
  return;
}

Assistant:

void growTo(unsigned int size, const T& pad) {
		if (size <= sz) {
			return;
		}
		reserve(size);
		for (unsigned int i = sz; i < size; i++) {
			new (&data[i]) T(pad);
		}
		sz = size;
	}